

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eltwise_x86.cpp
# Opt level: O2

int __thiscall
ncnn::Eltwise_x86::forward
          (Eltwise_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float *pfVar1;
  uint uVar2;
  Mat *m;
  Mat *this_00;
  _func_int **pp_Var3;
  void *pvVar4;
  void *pvVar5;
  void *pvVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  int q;
  ulong uVar17;
  ulong uVar18;
  _func_int *p_Var19;
  long lVar20;
  ulong uVar21;
  int iVar22;
  long lVar23;
  ulong uVar24;
  long lVar25;
  long lVar26;
  pointer pMVar27;
  long lVar28;
  int iVar29;
  undefined1 (*pauVar30) [16];
  undefined1 (*pauVar31) [16];
  float *pfVar32;
  float *pfVar33;
  float fVar34;
  float fVar39;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  
  m = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_start;
  uVar2 = m->c;
  uVar17 = (ulong)uVar2;
  iVar22 = m->h * m->w * m->elempack;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create_like(this_00,m,opt->blob_allocator);
  iVar29 = -100;
  if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
    pp_Var3 = this->_vptr_Eltwise_x86;
    p_Var19 = pp_Var3[-3];
    iVar29 = *(int *)(&this->field_0xd0 + (long)p_Var19);
    if (iVar29 == 0) {
      pMVar27 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar21 = 0;
      uVar24 = 0;
      if (0 < (int)uVar2) {
        uVar24 = uVar17;
      }
      for (; uVar21 != uVar24; uVar21 = uVar21 + 1) {
        lVar25 = this_00->elemsize * this_00->cstep * uVar21;
        pvVar4 = this_00->data;
        lVar23 = pMVar27[1].elemsize * pMVar27[1].cstep * uVar21;
        pvVar5 = pMVar27[1].data;
        lVar26 = m->elemsize * m->cstep * uVar21;
        pvVar6 = m->data;
        lVar28 = 0;
        lVar20 = 0;
        for (iVar29 = 0; iVar29 + 3 < iVar22; iVar29 = iVar29 + 4) {
          pfVar32 = (float *)((long)pvVar5 + lVar20 + lVar23);
          pfVar33 = (float *)((long)pvVar6 + lVar20 + lVar26);
          auVar38._0_4_ = *pfVar32 * *pfVar33;
          auVar38._4_4_ = pfVar32[1] * pfVar33[1];
          auVar38._8_4_ = pfVar32[2] * pfVar33[2];
          auVar38._12_4_ = pfVar32[3] * pfVar33[3];
          *(undefined1 (*) [16])((long)pvVar4 + lVar20 + lVar25) = auVar38;
          lVar20 = lVar20 + 0x10;
          lVar28 = lVar28 + 4;
        }
        for (; (int)lVar28 < iVar22; lVar28 = lVar28 + 1) {
          *(float *)((long)pvVar4 + lVar28 * 4 + lVar25) =
               *(float *)((long)pvVar5 + lVar28 * 4 + lVar23) *
               *(float *)((long)pvVar6 + lVar28 * 4 + lVar26);
        }
      }
      for (uVar21 = 2;
          pMVar27 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_start,
          uVar21 < (ulong)(((long)(bottom_blobs->
                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                                  .super__Vector_impl_data._M_finish - (long)pMVar27) / 0x48);
          uVar21 = uVar21 + 1) {
        pMVar27 = pMVar27 + uVar21;
        for (uVar18 = 0; uVar18 != uVar24; uVar18 = uVar18 + 1) {
          pvVar4 = pMVar27->data;
          sVar7 = pMVar27->elemsize;
          sVar8 = pMVar27->cstep;
          pfVar32 = (float *)(sVar8 * uVar18 * sVar7 + (long)pvVar4);
          pvVar5 = this_00->data;
          sVar9 = this_00->elemsize;
          sVar10 = this_00->cstep;
          pauVar30 = (undefined1 (*) [16])(sVar10 * uVar18 * sVar9 + (long)pvVar5);
          lVar20 = 0;
          for (iVar29 = 0; iVar29 + 3 < iVar22; iVar29 = iVar29 + 4) {
            auVar35._0_4_ = *pfVar32 * *(float *)*pauVar30;
            auVar35._4_4_ = pfVar32[1] * *(float *)((long)*pauVar30 + 4);
            auVar35._8_4_ = pfVar32[2] * *(float *)((long)*pauVar30 + 8);
            auVar35._12_4_ = pfVar32[3] * *(float *)((long)*pauVar30 + 0xc);
            *pauVar30 = auVar35;
            pfVar32 = pfVar32 + 4;
            pauVar30 = pauVar30 + 1;
            lVar20 = lVar20 + 4;
          }
          lVar23 = sVar10 * sVar9 * uVar18;
          for (; (int)lVar20 < iVar22; lVar20 = lVar20 + 1) {
            *(float *)((long)pvVar5 + lVar20 * 4 + lVar23) =
                 *(float *)((long)pvVar5 + lVar20 * 4 + lVar23) *
                 *(float *)((long)pvVar4 + lVar20 * 4 + sVar8 * sVar7 * uVar18);
          }
        }
      }
      p_Var19 = pp_Var3[-3];
      iVar29 = *(int *)(&this->field_0xd0 + (long)p_Var19);
    }
    if (iVar29 == 1) {
      pMVar27 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if (*(int *)(&this->field_0x104 + (long)p_Var19) == 0) {
        uVar21 = 0;
        uVar24 = 0;
        if (0 < (int)uVar2) {
          uVar24 = uVar17;
        }
        for (; uVar21 != uVar24; uVar21 = uVar21 + 1) {
          lVar23 = this_00->elemsize * this_00->cstep * uVar21;
          pvVar4 = this_00->data;
          lVar20 = pMVar27[1].elemsize * pMVar27[1].cstep * uVar21;
          pvVar5 = pMVar27[1].data;
          lVar25 = m->elemsize * m->cstep * uVar21;
          pvVar6 = m->data;
          lVar26 = 0;
          lVar28 = 0;
          for (iVar29 = 0; iVar29 + 3 < iVar22; iVar29 = iVar29 + 4) {
            pfVar32 = (float *)((long)pvVar5 + lVar28 + lVar20);
            pfVar33 = (float *)((long)pvVar6 + lVar28 + lVar25);
            auVar36._0_4_ = *pfVar32 + *pfVar33;
            auVar36._4_4_ = pfVar32[1] + pfVar33[1];
            auVar36._8_4_ = pfVar32[2] + pfVar33[2];
            auVar36._12_4_ = pfVar32[3] + pfVar33[3];
            *(undefined1 (*) [16])((long)pvVar4 + lVar28 + lVar23) = auVar36;
            lVar28 = lVar28 + 0x10;
            lVar26 = lVar26 + 4;
          }
          for (; (int)lVar26 < iVar22; lVar26 = lVar26 + 1) {
            *(float *)((long)pvVar4 + lVar26 * 4 + lVar23) =
                 *(float *)((long)pvVar5 + lVar26 * 4 + lVar20) +
                 *(float *)((long)pvVar6 + lVar26 * 4 + lVar25);
          }
        }
        for (uVar21 = 2;
            pMVar27 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_start,
            uVar21 < (ulong)(((long)(bottom_blobs->
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                    _M_impl.super__Vector_impl_data._M_finish - (long)pMVar27) /
                            0x48); uVar21 = uVar21 + 1) {
          pMVar27 = pMVar27 + uVar21;
          for (uVar18 = 0; uVar18 != uVar24; uVar18 = uVar18 + 1) {
            pvVar4 = pMVar27->data;
            sVar7 = pMVar27->elemsize;
            sVar8 = pMVar27->cstep;
            pfVar32 = (float *)(sVar8 * uVar18 * sVar7 + (long)pvVar4);
            pvVar5 = this_00->data;
            sVar9 = this_00->elemsize;
            sVar10 = this_00->cstep;
            pauVar30 = (undefined1 (*) [16])(sVar10 * uVar18 * sVar9 + (long)pvVar5);
            lVar20 = 0;
            for (iVar29 = 0; iVar29 + 3 < iVar22; iVar29 = iVar29 + 4) {
              auVar37._0_4_ = *pfVar32 + *(float *)*pauVar30;
              auVar37._4_4_ = pfVar32[1] + *(float *)((long)*pauVar30 + 4);
              auVar37._8_4_ = pfVar32[2] + *(float *)((long)*pauVar30 + 8);
              auVar37._12_4_ = pfVar32[3] + *(float *)((long)*pauVar30 + 0xc);
              *pauVar30 = auVar37;
              pfVar32 = pfVar32 + 4;
              pauVar30 = pauVar30 + 1;
              lVar20 = lVar20 + 4;
            }
            lVar23 = sVar10 * sVar9 * uVar18;
            for (; (int)lVar20 < iVar22; lVar20 = lVar20 + 1) {
              *(float *)((long)pvVar5 + lVar20 * 4 + lVar23) =
                   *(float *)((long)pvVar5 + lVar20 * 4 + lVar23) +
                   *(float *)((long)pvVar4 + lVar20 * 4 + sVar8 * sVar7 * uVar18);
            }
          }
        }
      }
      else {
        pp_Var3 = this->_vptr_Eltwise_x86;
        uVar21 = 0;
        uVar24 = 0;
        if (0 < (int)uVar2) {
          uVar24 = uVar17;
        }
        for (; uVar21 != uVar24; uVar21 = uVar21 + 1) {
          fVar34 = (float)**(undefined8 **)(&this->field_0xd8 + (long)pp_Var3[-3]);
          fVar39 = (float)((ulong)**(undefined8 **)(&this->field_0xd8 + (long)pp_Var3[-3]) >> 0x20);
          lVar25 = m->elemsize * m->cstep * uVar21;
          pvVar4 = m->data;
          lVar26 = pMVar27[1].elemsize * pMVar27[1].cstep * uVar21;
          pvVar5 = pMVar27[1].data;
          lVar28 = this_00->elemsize * this_00->cstep * uVar21;
          pvVar6 = this_00->data;
          lVar23 = 0;
          lVar20 = 0;
          for (iVar29 = 0; iVar29 + 3 < iVar22; iVar29 = iVar29 + 4) {
            pfVar32 = (float *)((long)pvVar4 + lVar20 + lVar25);
            fVar11 = pfVar32[1];
            fVar12 = pfVar32[2];
            fVar13 = pfVar32[3];
            pfVar33 = (float *)((long)pvVar5 + lVar20 + lVar26);
            fVar14 = pfVar33[1];
            fVar15 = pfVar33[2];
            fVar16 = pfVar33[3];
            pfVar1 = (float *)((long)pvVar6 + lVar20 + lVar28);
            *pfVar1 = *pfVar33 * fVar39 + *pfVar32 * fVar34;
            pfVar1[1] = fVar14 * fVar39 + fVar11 * fVar34;
            pfVar1[2] = fVar15 * fVar39 + fVar12 * fVar34;
            pfVar1[3] = fVar16 * fVar39 + fVar13 * fVar34;
            lVar20 = lVar20 + 0x10;
            lVar23 = lVar23 + 4;
          }
          for (; (int)lVar23 < iVar22; lVar23 = lVar23 + 1) {
            *(float *)((long)pvVar6 + lVar23 * 4 + lVar28) =
                 *(float *)((long)pvVar5 + lVar23 * 4 + lVar26) * fVar39 +
                 *(float *)((long)pvVar4 + lVar23 * 4 + lVar25) * fVar34;
          }
        }
        for (uVar21 = 2;
            pMVar27 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_start,
            uVar21 < (ulong)(((long)(bottom_blobs->
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                    _M_impl.super__Vector_impl_data._M_finish - (long)pMVar27) /
                            0x48); uVar21 = uVar21 + 1) {
          pMVar27 = pMVar27 + uVar21;
          pp_Var3 = this->_vptr_Eltwise_x86;
          for (uVar18 = 0; uVar18 != uVar24; uVar18 = uVar18 + 1) {
            pvVar4 = pMVar27->data;
            sVar7 = pMVar27->elemsize;
            sVar8 = pMVar27->cstep;
            pfVar32 = (float *)(sVar8 * uVar18 * sVar7 + (long)pvVar4);
            pvVar5 = this_00->data;
            sVar9 = this_00->elemsize;
            sVar10 = this_00->cstep;
            pfVar33 = (float *)(sVar10 * uVar18 * sVar9 + (long)pvVar5);
            fVar34 = *(float *)(*(long *)(&this->field_0xd8 + (long)pp_Var3[-3]) + uVar21 * 4);
            lVar20 = 0;
            for (iVar29 = 0; iVar29 + 3 < iVar22; iVar29 = iVar29 + 4) {
              fVar39 = pfVar32[1];
              fVar11 = pfVar32[2];
              fVar12 = pfVar32[3];
              *pfVar33 = *pfVar32 * fVar34 + *pfVar33;
              pfVar33[1] = fVar39 * fVar34 + pfVar33[1];
              pfVar33[2] = fVar11 * fVar34 + pfVar33[2];
              pfVar33[3] = fVar12 * fVar34 + pfVar33[3];
              pfVar32 = pfVar32 + 4;
              pfVar33 = pfVar33 + 4;
              lVar20 = lVar20 + 4;
            }
            lVar23 = sVar10 * sVar9 * uVar18;
            for (; (int)lVar20 < iVar22; lVar20 = lVar20 + 1) {
              *(float *)((long)pvVar5 + lVar20 * 4 + lVar23) =
                   *(float *)((long)pvVar4 + lVar20 * 4 + sVar8 * sVar7 * uVar18) * fVar34 +
                   *(float *)((long)pvVar5 + lVar20 * 4 + lVar23);
            }
          }
        }
      }
    }
    iVar29 = 0;
    if (*(int *)(&this->field_0xd0 + (long)this->_vptr_Eltwise_x86[-3]) == 2) {
      uVar24 = 2;
      pMVar27 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar21 = 0;
      if ((int)uVar2 < 1) {
        uVar17 = uVar21;
      }
      for (; uVar21 != uVar17; uVar21 = uVar21 + 1) {
        lVar20 = m->elemsize * m->cstep * uVar21;
        pvVar4 = m->data;
        lVar25 = pMVar27[1].elemsize * pMVar27[1].cstep * uVar21;
        pvVar5 = pMVar27[1].data;
        lVar23 = this_00->elemsize * this_00->cstep * uVar21;
        pvVar6 = this_00->data;
        lVar26 = 0;
        lVar28 = 0;
        for (iVar29 = 0; iVar29 + 3 < iVar22; iVar29 = iVar29 + 4) {
          auVar38 = maxps(*(undefined1 (*) [16])((long)pvVar4 + lVar28 + lVar20),
                          *(undefined1 (*) [16])((long)pvVar5 + lVar28 + lVar25));
          *(undefined1 (*) [16])((long)pvVar6 + lVar28 + lVar23) = auVar38;
          lVar28 = lVar28 + 0x10;
          lVar26 = lVar26 + 4;
        }
        for (; (int)lVar26 < iVar22; lVar26 = lVar26 + 1) {
          fVar39 = *(float *)((long)pvVar5 + lVar26 * 4 + lVar25);
          fVar34 = *(float *)((long)pvVar4 + lVar26 * 4 + lVar20);
          if (fVar39 <= fVar34) {
            fVar39 = fVar34;
          }
          *(float *)((long)pvVar6 + lVar26 * 4 + lVar23) = fVar39;
        }
      }
      for (; pMVar27 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_start,
          uVar24 < (ulong)(((long)(bottom_blobs->
                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                                  .super__Vector_impl_data._M_finish - (long)pMVar27) / 0x48);
          uVar24 = uVar24 + 1) {
        pMVar27 = pMVar27 + uVar24;
        for (uVar21 = 0; uVar21 != uVar17; uVar21 = uVar21 + 1) {
          pvVar4 = pMVar27->data;
          sVar7 = pMVar27->elemsize;
          sVar8 = pMVar27->cstep;
          pauVar30 = (undefined1 (*) [16])(sVar8 * uVar21 * sVar7 + (long)pvVar4);
          pvVar5 = this_00->data;
          sVar9 = this_00->elemsize;
          sVar10 = this_00->cstep;
          pauVar31 = (undefined1 (*) [16])(sVar10 * uVar21 * sVar9 + (long)pvVar5);
          lVar20 = 0;
          for (iVar29 = 0; iVar29 + 3 < iVar22; iVar29 = iVar29 + 4) {
            auVar38 = maxps(*pauVar31,*pauVar30);
            *pauVar31 = auVar38;
            pauVar30 = pauVar30 + 1;
            pauVar31 = pauVar31 + 1;
            lVar20 = lVar20 + 4;
          }
          lVar23 = sVar10 * sVar9 * uVar21;
          for (; (int)lVar20 < iVar22; lVar20 = lVar20 + 1) {
            fVar39 = *(float *)((long)pvVar5 + lVar20 * 4 + lVar23);
            fVar34 = *(float *)((long)pvVar4 + lVar20 * 4 + sVar8 * sVar7 * uVar21);
            if (fVar39 <= fVar34) {
              fVar39 = fVar34;
            }
            *(float *)((long)pvVar5 + lVar20 * 4 + lVar23) = fVar39;
          }
        }
      }
      iVar29 = 0;
    }
  }
  return iVar29;
}

Assistant:

int Eltwise_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int elempack = bottom_blob.elempack;
    int size = w * h * elempack;

    Mat& top_blob = top_blobs[0];
    top_blob.create_like(bottom_blob, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (op_type == Operation_PROD)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m512 _p1 = _mm512_loadu_ps(ptr1);
                _p = _mm512_mul_ps(_p, _p1);
                _mm512_storeu_ps(outptr, _p);

                ptr += 16;
                ptr1 += 16;
                outptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _p1 = _mm256_loadu_ps(ptr1);
                _p = _mm256_mul_ps(_p, _p1);
                _mm256_storeu_ps(outptr, _p);

                ptr += 8;
                ptr1 += 8;
                outptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_load_ps(ptr);
                __m128 _p1 = _mm_load_ps(ptr1);
                _p = _mm_mul_ps(_p, _p1);
                _mm_store_ps(outptr, _p);

                ptr += 4;
                ptr1 += 4;
                outptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                *outptr = *ptr * *ptr1;

                ptr++;
                ptr1++;
                outptr++;
            }
        }

        for (size_t b = 2; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob2 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob2.channel(q);
                float* outptr = top_blob.channel(q);

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(outptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr);
                    _p = _mm512_mul_ps(_p, _p1);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(outptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr);
                    _p = _mm256_mul_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    outptr += 8;
                }
#endif // __AVX__
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(outptr);
                    __m128 _p1 = _mm_load_ps(ptr);
                    _p = _mm_mul_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr *= *ptr;

                    ptr++;
                    outptr++;
                }
            }
        }
    }
    if (op_type == Operation_SUM)
    {
        if (coeffs.w == 0)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr1);
                    _p = _mm512_add_ps(_p, _p1);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    ptr1 += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr1);
                    _p = _mm256_add_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    ptr1 += 8;
                    outptr += 8;
                }
#endif // __AVX__
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    __m128 _p1 = _mm_load_ps(ptr1);
                    _p = _mm_add_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    ptr1 += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr = *ptr + *ptr1;

                    ptr++;
                    ptr1++;
                    outptr++;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                    for (; i + 15 < size; i += 16)
                    {
                        __m512 _p = _mm512_loadu_ps(outptr);
                        __m512 _p1 = _mm512_loadu_ps(ptr);
                        _p = _mm512_add_ps(_p, _p1);
                        _mm512_storeu_ps(outptr, _p);

                        ptr += 16;
                        outptr += 16;
                    }
#endif // __AVX512F__
                    for (; i + 7 < size; i += 8)
                    {
                        __m256 _p = _mm256_loadu_ps(outptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr);
                        _p = _mm256_add_ps(_p, _p1);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        outptr += 8;
                    }
#endif // __AVX__
                    for (; i + 3 < size; i += 4)
                    {
                        __m128 _p = _mm_load_ps(outptr);
                        __m128 _p1 = _mm_load_ps(ptr);
                        _p = _mm_add_ps(_p, _p1);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        outptr += 4;
                    }
#endif // __SSE2__
                    for (; i < size; i++)
                    {
                        *outptr += *ptr;

                        ptr++;
                        outptr++;
                    }
                }
            }
        }
        else
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                const float coeff0 = coeffs[0];
                const float coeff1 = coeffs[1];

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _coeff0_avx512 = _mm512_set1_ps(coeff0);
                __m512 _coeff1_avx512 = _mm512_set1_ps(coeff1);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr1);
                    _p = _mm512_mul_ps(_p, _coeff0_avx512);
                    _p = _mm512_fmadd_ps(_p1, _coeff1_avx512, _p);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    ptr1 += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                __m256 _coeff0_avx = _mm256_set1_ps(coeff0);
                __m256 _coeff1_avx = _mm256_set1_ps(coeff1);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr1);
                    _p = _mm256_mul_ps(_p, _coeff0_avx);
                    _p = _mm256_comp_fmadd_ps(_p1, _coeff1_avx, _p);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    ptr1 += 8;
                    outptr += 8;
                }
#endif // __AVX__
                __m128 _coeff0 = _mm_set1_ps(coeff0);
                __m128 _coeff1 = _mm_set1_ps(coeff1);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    __m128 _p1 = _mm_load_ps(ptr1);
                    _p = _mm_mul_ps(_p, _coeff0);
                    _p1 = _mm_mul_ps(_p1, _coeff1);
                    _p = _mm_add_ps(_p1, _p);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    ptr1 += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr = *ptr * coeff0 + *ptr1 * coeff1;

                    ptr++;
                    ptr1++;
                    outptr++;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    const float coeff = coeffs[b];

                    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                    __m512 _coeff_avx512 = _mm512_set1_ps(coeff);
                    for (; i + 15 < size; i += 16)
                    {
                        __m512 _p = _mm512_loadu_ps(outptr);
                        __m512 _p1 = _mm512_loadu_ps(ptr);
                        _p = _mm512_fmadd_ps(_p1, _coeff_avx512, _p);
                        _mm512_storeu_ps(outptr, _p);

                        ptr += 16;
                        outptr += 16;
                    }
#endif // __AVX512F__
                    __m256 _coeff_avx = _mm256_set1_ps(coeff);
                    for (; i + 7 < size; i += 8)
                    {
                        __m256 _p = _mm256_loadu_ps(outptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr);
                        _p = _mm256_comp_fmadd_ps(_p1, _coeff_avx, _p);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        outptr += 8;
                    }
#endif // __AVX__
                    __m128 _coeff = _mm_set1_ps(coeff);
                    for (; i + 3 < size; i += 4)
                    {
                        __m128 _p1 = _mm_load_ps(ptr);
                        __m128 _p = _mm_load_ps(outptr);
                        _p1 = _mm_mul_ps(_p1, _coeff);
                        _p = _mm_add_ps(_p1, _p);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        outptr += 4;
                    }
#endif // __SSE2__
                    for (; i < size; i++)
                    {
                        *outptr += *ptr * coeff;

                        ptr++;
                        outptr++;
                    }
                }
            }
        }
    }
    if (op_type == Operation_MAX)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m512 _p1 = _mm512_loadu_ps(ptr1);
                _p = _mm512_max_ps(_p, _p1);
                _mm512_storeu_ps(outptr, _p);

                ptr += 16;
                ptr1 += 16;
                outptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _p1 = _mm256_loadu_ps(ptr1);
                _p = _mm256_max_ps(_p, _p1);
                _mm256_storeu_ps(outptr, _p);

                ptr += 8;
                ptr1 += 8;
                outptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_load_ps(ptr);
                __m128 _p1 = _mm_load_ps(ptr1);
                _p = _mm_max_ps(_p, _p1);
                _mm_store_ps(outptr, _p);

                ptr += 4;
                ptr1 += 4;
                outptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                *outptr = std::max(*ptr, *ptr1);

                ptr++;
                ptr1++;
                outptr++;
            }
        }

        for (size_t b = 2; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob2 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob2.channel(q);
                float* outptr = top_blob.channel(q);

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(outptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr);
                    _p = _mm512_max_ps(_p, _p1);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(outptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr);
                    _p = _mm256_max_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    outptr += 8;
                }
#endif // __AVX__
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(outptr);
                    __m128 _p1 = _mm_load_ps(ptr);
                    _p = _mm_max_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr = std::max(*ptr, *outptr);

                    ptr++;
                    outptr++;
                }
            }
        }
    }

    return 0;
}